

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O3

void __thiscall dg::vr::StructureAnalyzer::collectAllocatedAreas(StructureAnalyzer *this)

{
  Value VVar1;
  long lVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Value *val;
  long lVar7;
  long lVar8;
  CallInst *call;
  AllocaInst *alloca;
  Value *local_40;
  Value *local_38;
  
  lVar6 = *(long *)(*(long *)this + 0x20);
  lVar4 = *(long *)this + 0x18;
  if (lVar6 != lVar4) {
    do {
      lVar5 = lVar6 + -0x38;
      if (lVar6 == 0) {
        lVar5 = 0;
      }
      for (lVar2 = *(long *)(lVar5 + 0x50); lVar2 != lVar5 + 0x48; lVar2 = *(long *)(lVar2 + 8)) {
        lVar8 = lVar2 + -0x18;
        if (lVar2 == 0) {
          lVar8 = 0;
        }
        for (lVar7 = *(long *)(lVar8 + 0x30); lVar7 != lVar8 + 0x28; lVar7 = *(long *)(lVar7 + 8)) {
          val = (Value *)(lVar7 + -0x18);
          if (lVar7 == 0) {
            val = (Value *)0x0;
          }
          VVar1 = val[0x10];
          local_38 = val;
          if (VVar1 != (Value)0x3a) {
            local_38 = (Value *)0x0;
          }
          if (VVar1 == (Value)0x3a && lVar7 != 0) {
            std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
            emplace_back<llvm::AllocaInst_const*&>
                      ((vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>> *)
                       (this + 0xb8),(AllocaInst **)&local_38);
          }
          else {
            local_40 = val;
            if (VVar1 != (Value)0x53) {
              local_40 = (Value *)0x0;
            }
            if ((VVar1 == (Value)0x53 && lVar7 != 0) && (bVar3 = isValidAllocationCall(val), bVar3))
            {
              std::vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>>::
              emplace_back<llvm::CallInst_const*&>
                        ((vector<dg::vr::AllocatedArea,std::allocator<dg::vr::AllocatedArea>> *)
                         (this + 0xb8),(CallInst **)&local_40);
            }
          }
        }
      }
      lVar6 = *(long *)(lVar6 + 8);
    } while (lVar6 != lVar4);
  }
  return;
}

Assistant:

void StructureAnalyzer::collectAllocatedAreas() {
    // compute allocated areas throughout the code
    for (const llvm::Function &function : module) {
        for (const llvm::BasicBlock &block : function) {
            for (const llvm::Instruction &inst : block) {
                if (const auto *alloca =
                            llvm::dyn_cast<llvm::AllocaInst>(&inst)) {
                    allocatedAreas.emplace_back(alloca);
                }

                else if (const auto *call =
                                 llvm::dyn_cast<llvm::CallInst>(&inst)) {
                    if (isValidAllocationCall(call)) {
                        allocatedAreas.emplace_back(call);
                    }
                }
            }
        }
    }
}